

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawReadBuffersErrorsTest::Clean
          (DrawReadBuffersErrorsTest *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_fbo_valid != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_fbo_valid);
    this->m_fbo_valid = 0;
  }
  this->m_fbo_invalid = 0;
  this->m_attachment_invalid = 0;
  this->m_attachments_invalid[0] = 0;
  this->m_attachments_invalid[1] = 0;
  operator_delete(this->m_attachments_too_many,4);
  this->m_attachments_too_many = (GLenum *)0x0;
  this->m_attachments_too_many_count = 0;
  do {
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void DrawReadBuffersErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_fbo_valid)
	{
		gl.deleteFramebuffers(1, &m_fbo_valid);
		m_fbo_valid = 0;
	}

	/* Set initial values - all test shall have the same environment. */
	m_fbo_invalid			 = 0;
	m_attachment_invalid	 = 0;
	m_attachments_invalid[0] = 0;
	m_attachments_invalid[1] = 0;

	delete m_attachments_too_many;

	m_attachments_too_many = DE_NULL;

	m_attachments_too_many_count = 0;

	/* Errors clean up. */
	while (gl.getError())
		;
}